

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mchain_details.hpp
# Opt level: O2

void __thiscall
so_5::mchain_props::
mchain_template<so_5::mchain_props::details::limited_preallocated_demand_queue,_so_5::impl::msg_tracing_helpers::mchain_tracing_enabled_base>
::try_to_store_message_to_queue
          (mchain_template<so_5::mchain_props::details::limited_preallocated_demand_queue,_so_5::impl::msg_tracing_helpers::mchain_tracing_enabled_base>
           *this,type_index *msg_type,message_ref_t *message,invocation_type_t demand_type)

{
  overflow_reaction_t oVar1;
  long lVar2;
  anon_class_24_3_b3d561ce logging_lambda;
  demand_t *d;
  bool bVar3;
  anon_class_16_2_f638b178 __p;
  bool queue_full;
  unique_lock<std::mutex> lock;
  deliver_op_tracer tracer;
  undefined6 in_stack_ffffffffffffff60;
  undefined1 in_stack_ffffffffffffff67 [17];
  deliver_op_tracer local_88;
  deliver_op_tracer *local_60;
  mchain_template<so_5::mchain_props::details::limited_preallocated_demand_queue,_so_5::impl::msg_tracing_helpers::mchain_tracing_enabled_base>
  *pmStack_58;
  type_index *local_50;
  duration<long,_std::ratio<1L,_1000000000L>_> local_48 [4];
  
  local_88.m_tracer = (this->super_mchain_tracing_enabled_base).m_tracer;
  local_88.m_op_name = "service_request";
  if (demand_type == event) {
    local_88.m_op_name = "message";
  }
  local_88.m_chain = &this->super_abstract_message_chain_t;
  local_88.m_msg_type = msg_type;
  local_88.m_message = message;
  std::unique_lock<std::mutex>::unique_lock
            ((unique_lock<std::mutex> *)&stack0xffffffffffffff68,&this->m_lock);
  if (this->m_status == closed) goto LAB_00254604;
  bVar3 = (this->m_queue).m_max_size == (this->m_queue).m_size;
  if (bVar3) {
    lVar2 = (this->m_capacity).m_overflow_timeout.__r;
    if (lVar2 != 0) {
      __p.queue_full = (bool *)&stack0xffffffffffffff66;
      __p.this = this;
      local_48[0].__r = lVar2;
      std::condition_variable::
      wait_for<long,std::ratio<1l,1000000000l>,so_5::mchain_props::mchain_template<so_5::mchain_props::details::limited_preallocated_demand_queue,so_5::impl::msg_tracing_helpers::mchain_tracing_enabled_base>::try_to_store_message_to_queue(std::type_index_const&,so_5::intrusive_ptr_t<so_5::message_t>const&,so_5::invocation_type_t)::_lambda()_1_>
                (&this->m_overflow_cond,(unique_lock<std::mutex> *)&stack0xffffffffffffff68,local_48
                 ,__p);
      if ((bVar3 & 1U) == 0) goto LAB_002545ee;
    }
    oVar1 = (this->m_capacity).m_overflow_reaction;
    if (oVar1 == throw_exception) {
      impl::msg_tracing_helpers::mchain_tracing_enabled_base::deliver_op_tracer::
      overflow_throw_exception(&local_88);
      std::__cxx11::string::string
                ((string *)local_48,
                 "an attempt to push message to full mchain with overflow_reaction_t::throw_exception policy"
                 ,(allocator *)&stack0xffffffffffffff67);
      exception_t::raise(0x282f08);
      std::__cxx11::string::~string((string *)local_48);
    }
    else if (oVar1 == remove_oldest) {
      d = details::limited_preallocated_demand_queue::front(&this->m_queue);
      impl::msg_tracing_helpers::mchain_tracing_enabled_base::deliver_op_tracer::
      overflow_remove_oldest(&local_88,d);
      details::limited_preallocated_demand_queue::pop_front(&this->m_queue);
    }
    else {
      if (oVar1 == drop_newest) {
        impl::msg_tracing_helpers::mchain_tracing_enabled_base::deliver_op_tracer::
        overflow_drop_newest(&local_88);
        goto LAB_00254604;
      }
      local_60 = &local_88;
      logging_lambda.tracer._6_1_ = bVar3;
      logging_lambda.tracer._0_6_ = in_stack_ffffffffffffff60;
      logging_lambda._7_17_ = in_stack_ffffffffffffff67;
      pmStack_58 = this;
      local_50 = msg_type;
      so_5::details::
      abort_on_fatal_error<so_5::mchain_props::mchain_template<so_5::mchain_props::details::limited_preallocated_demand_queue,so_5::impl::msg_tracing_helpers::mchain_tracing_enabled_base>::try_to_store_message_to_queue(std::type_index_const&,so_5::intrusive_ptr_t<so_5::message_t>const&,so_5::invocation_type_t)::_lambda()_2_>
                (logging_lambda);
    }
  }
LAB_002545ee:
  complete_store_message_to_queue(this,&local_88,msg_type,message,demand_type);
LAB_00254604:
  std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)&stack0xffffffffffffff68);
  return;
}

Assistant:

void
		try_to_store_message_to_queue(
			const std::type_index & msg_type,
			const message_ref_t & message,
			invocation_type_t demand_type )
			{
				typename TRACING_BASE::deliver_op_tracer tracer{
						*this, // as tracing base.
						*this, // as chain.
						msg_type,
						message,
						demand_type };

				std::unique_lock< std::mutex > lock{ m_lock };

				// Message cannot be stored to closed chain.
				if( details::status::closed == m_status )
					return;

				// If queue full and waiting on full queue is enabled we
				// must wait for some time until there will be some space in
				// the queue.
				bool queue_full = m_queue.is_full();
				if( queue_full && m_capacity.is_overflow_timeout_defined() )
					{
						m_overflow_cond.wait_for(
								lock,
								m_capacity.overflow_timeout(),
								[this, &queue_full] {
									queue_full = m_queue.is_full();
									return !queue_full ||
											details::status::closed == m_status;
								} );
					}

				// If queue still full we must perform some reaction.
				if( queue_full )
					{
						const auto reaction = m_capacity.overflow_reaction();
						if( overflow_reaction_t::drop_newest == reaction )
							{
								// New message must be simply ignored.
								tracer.overflow_drop_newest();
								return;
							}
						else if( overflow_reaction_t::remove_oldest == reaction )
							{
								// The oldest message must be simply removed.
								tracer.overflow_remove_oldest( m_queue.front() );
								m_queue.pop_front();
							}
						else if( overflow_reaction_t::throw_exception == reaction )
							{
								tracer.overflow_throw_exception();
								SO_5_THROW_EXCEPTION(
										rc_msg_chain_overflow,
										"an attempt to push message to full mchain "
										"with overflow_reaction_t::throw_exception policy" );
							}
						else
							{
								so_5::details::abort_on_fatal_error( [&] {
										tracer.overflow_throw_exception();
										SO_5_LOG_ERROR( m_env, log_stream ) {
											log_stream << "overflow_reaction_t::abort_app "
													"will be performed for mchain (id="
													<< m_id << "), msg_type: "
													<< msg_type.name()
													<< ". Application will be aborted"
													<< std::endl;
										}
									} );
							}
					}

				complete_store_message_to_queue(
						tracer,
						msg_type,
						message,
						demand_type );
			}